

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadPool.cpp
# Opt level: O0

void __thiscall IlmThread_3_2::TaskGroup::Data::waitForEmpty(Data *this)

{
  void *in_RSI;
  long in_RDI;
  int count;
  memory_order __b;
  undefined4 local_24;
  
  Semaphore::wait((Semaphore *)(in_RDI + 8),in_RSI);
  local_24 = 0;
  while (std::operator&(memory_order_seq_cst,__memory_order_mask), 0 < *(int *)(in_RDI + 4)) {
    local_24 = local_24 + 1;
    if (100 < local_24) {
      std::this_thread::yield();
      local_24 = 0;
    }
  }
  return;
}

Assistant:

void
TaskGroup::Data::waitForEmpty ()
{
    //
    // A TaskGroup acts like an "inverted" semaphore: if the count
    // is above 0 then waiting on the taskgroup will block.  The
    // destructor waits until the taskgroup is empty before returning.
    //

    isEmpty.wait ();

    // pseudo spin to wait for the notifying thread to finish the post
    // to avoid a premature deletion of the semaphore
    int count = 0;
    while (inFlight.load () > 0)
    {
        ++count;
        if (count > 100)
        {
            std::this_thread::yield ();
            count = 0;
        }
    }
}